

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleShaderRenderCase.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
          (MultisampleRenderCase *this,Context *context,char *name,char *desc,int numSamples,
          RenderTarget target,int renderSize,int flags)

{
  _Rb_tree_header *p_Var1;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleRenderCase_0216a1f0;
  this->m_numRequestedSamples = numSamples;
  this->m_renderTarget = target;
  this->m_renderSize = renderSize;
  this->m_perIterationShader = (bool)((byte)flags & 1);
  this->m_verifyTextureSampleBuffers = (bool)(target == TARGET_TEXTURE & (byte)((flags & 2U) >> 1));
  this->m_numTargetSamples = -1;
  this->m_buffer = 0;
  this->m_resolveBuffer = 0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_fbo = 0;
  this->m_fboTexture = 0;
  this->m_textureSamplerProgram = (ShaderProgram *)0x0;
  this->m_fboRbo = 0;
  this->m_resolveFbo = 0;
  this->m_resolveFboTexture = 0;
  this->m_iteration = 0;
  this->m_numIterations = 1;
  this->m_renderMode = 0;
  this->m_renderCount = 0;
  this->m_renderVao = 0;
  this->m_resolveVao = 0;
  (this->m_renderSceneDescription)._M_dataplus._M_p =
       (pointer)&(this->m_renderSceneDescription).field_2;
  (this->m_renderSceneDescription)._M_string_length = 0;
  (this->m_renderSceneDescription).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

MultisampleRenderCase::MultisampleRenderCase (Context& context, const char* name, const char* desc, int numSamples, RenderTarget target, int renderSize, int flags)
	: TestCase						(context, name, desc)
	, m_numRequestedSamples			(numSamples)
	, m_renderTarget				(target)
	, m_renderSize					(renderSize)
	, m_perIterationShader			((flags & FLAG_PER_ITERATION_SHADER) != 0)
	, m_verifyTextureSampleBuffers	((flags & FLAG_VERIFY_MSAA_TEXTURE_SAMPLE_BUFFERS) != 0 && target == TARGET_TEXTURE)
	, m_numTargetSamples			(-1)
	, m_buffer						(0)
	, m_resolveBuffer				(0)
	, m_program						(DE_NULL)
	, m_fbo							(0)
	, m_fboTexture					(0)
	, m_textureSamplerProgram		(DE_NULL)
	, m_fboRbo						(0)
	, m_resolveFbo					(0)
	, m_resolveFboTexture			(0)
	, m_iteration					(0)
	, m_numIterations				(1)
	, m_renderMode					(0)
	, m_renderCount					(0)
	, m_renderVao					(0)
	, m_resolveVao					(0)
{
	DE_ASSERT(target < TARGET_LAST);
}